

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void anon_unknown.dwarf_1092::mndl<Imf_3_2::Rgba>
               (Array2D<Imf_3_2::Rgba> *px,int w,int h,int xMin,int xMax,int yMin,int yMax,
               int xSamples,int ySamples,double rMin,double rMax,double iMin,double aspect,
               double rSeed,double iSeed)

{
  long lVar1;
  Rgba *pRVar2;
  double dVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint16_t uVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  long local_b0;
  int local_a8;
  double local_a0;
  
  lVar5 = _imath_half_to_float_table;
  iVar11 = 6;
  if (xSamples < 6) {
    iVar11 = xSamples;
  }
  iVar10 = 6;
  if (ySamples < 6) {
    iVar10 = ySamples;
  }
  if (yMin < yMax) {
    fVar21 = (1.0 / (float)iVar10) * (1.0 / (float)iVar11);
    lVar1 = px->_sizeY;
    pRVar2 = px->_data;
    local_b0 = (long)yMin;
    do {
      if (xMin < xMax) {
        lVar8 = (local_b0 - yMin) * lVar1;
        lVar15 = (long)xMin;
        do {
          lVar20 = lVar15 - xMin;
          pRVar2[lVar8 + lVar20].r = 0;
          pRVar2[lVar8 + lVar20].g = 0;
          pRVar2[lVar8 + lVar20].b._h = 0;
          lVar6 = _imath_half_to_float_table;
          if (0 < xSamples) {
            local_a8 = (int)lVar15;
            iVar13 = 0;
            local_a0 = 0.0;
            do {
              if (0 < ySamples) {
                uVar17 = (ulong)pRVar2[lVar8 + lVar20].r._h;
                uVar14 = (ulong)pRVar2[lVar8 + lVar20].g._h;
                uVar18 = (ulong)pRVar2[lVar8 + lVar20].b._h;
                iVar12 = 0;
                dVar27 = 0.0;
                do {
                  uVar16 = 0;
                  dVar3 = rSeed;
                  dVar23 = iSeed;
                  do {
                    uVar9 = uVar16 + 1;
                    if (0xfe < uVar16) break;
                    dVar26 = dVar3 * dVar3 - dVar23 * dVar23;
                    dVar23 = (dVar3 + dVar3) * dVar23 +
                             (dVar27 * (double)(1.0 / (float)iVar10) + (double)(int)local_b0) *
                             ((((aspect * (rMax - rMin) * (double)h) / (double)w + iMin) - iMin) /
                             (double)h) + iMin;
                    dVar3 = (local_a0 * (double)(1.0 / (float)iVar11) + (double)local_a8) *
                            ((rMax - rMin) / (double)w) + rMin + dVar26;
                    uVar16 = uVar9;
                  } while (dVar26 < 100.0);
                  fVar24 = (float)(int)uVar9 * 0.00390625;
                  if ((uint)fVar24 < 0x38800000) {
                    if ((uint)fVar24 < 0x33000001) {
                      uVar19 = 0;
                    }
                    else {
                      uVar16 = (uint)fVar24 & 0x7fffff | 0x800000;
                      cVar4 = (char)((uint)fVar24 >> 0x17);
                      uVar19 = (uint16_t)(uVar16 >> (0x7eU - cVar4 & 0x1f));
                      if (0x80000000 < uVar16 << (cVar4 + 0xa2U & 0x1f)) {
                        uVar19 = uVar19 + 1;
                      }
                    }
                  }
                  else if ((uint)fVar24 < 0x7f800000) {
                    if ((uint)fVar24 < 0x477ff000) {
                      uVar19 = (uint16_t)
                               ((int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >>
                               0xd);
                    }
                    else {
                      uVar19 = 0x7c00;
                    }
                  }
                  else {
                    uVar19 = 0x7c00;
                    if (fVar24 != INFINITY) {
                      uVar16 = (uint)fVar24 >> 0xd & 0x3ff;
                      uVar19 = (ushort)(uVar16 == 0) | (ushort)uVar16 | 0x7c00;
                    }
                  }
                  pRVar2[lVar8 + lVar20].a._h = uVar19;
                  fVar24 = fVar24 * 4.0;
                  fVar22 = (fVar24 - (float)(int)fVar24) + (fVar24 - (float)(int)fVar24);
                  fVar25 = (float)(~-(uint)(fVar22 < 1.0) & (uint)(2.0 - fVar22) |
                                  (uint)fVar22 & -(uint)(fVar22 < 1.0)) * 4.0 + 0.1 +
                           *(float *)(lVar6 + (uVar17 & 0xffff) * 4);
                  fVar22 = ABS(fVar25);
                  uVar16 = (uint)fVar25 >> 0x10 & 0x8000;
                  uVar17 = (ulong)uVar16;
                  if ((uint)fVar22 < 0x38800000) {
                    if (0x33000000 < (uint)fVar22) {
                      uVar9 = (uint)fVar22 & 0x7fffff | 0x800000;
                      cVar4 = (char)((uint)fVar22 >> 0x17);
                      uVar16 = uVar16 | uVar9 >> (0x7eU - cVar4 & 0x1f);
                      uVar17 = (ulong)uVar16;
                      if (0x80000000 < uVar9 << (cVar4 + 0xa2U & 0x1f)) {
                        uVar17 = (ulong)(uVar16 + 1);
                      }
                    }
                  }
                  else if ((uint)fVar22 < 0x7f800000) {
                    if ((uint)fVar22 < 0x477ff000) {
                      uVar17 = (ulong)((int)fVar22 + 0x8000fff +
                                       (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd | uVar16);
                    }
                    else {
                      uVar17 = (ulong)(uVar16 | 0x7c00);
                    }
                  }
                  else {
                    uVar17 = (ulong)(uVar16 | 0x7c00);
                    if (fVar22 != INFINITY) {
                      uVar9 = (uint)fVar22 >> 0xd & 0x3ff;
                      uVar17 = (ulong)(uVar16 | 0x7c00 | uVar9 | (uint)(uVar9 == 0));
                    }
                  }
                  pRVar2[lVar8 + lVar20].r._h = (uint16_t)uVar17;
                  fVar22 = (fVar24 + 0.33333) - (float)(int)(fVar24 + 0.33333);
                  fVar22 = fVar22 + fVar22;
                  fVar25 = (float)(~-(uint)(fVar22 < 1.0) & (uint)(2.0 - fVar22) |
                                  (uint)fVar22 & -(uint)(fVar22 < 1.0)) * 4.0 + 0.1 +
                           *(float *)(lVar6 + (uVar14 & 0xffff) * 4);
                  fVar22 = ABS(fVar25);
                  uVar16 = (uint)fVar25 >> 0x10 & 0x8000;
                  uVar14 = (ulong)uVar16;
                  if ((uint)fVar22 < 0x38800000) {
                    if (0x33000000 < (uint)fVar22) {
                      uVar9 = (uint)fVar22 & 0x7fffff | 0x800000;
                      cVar4 = (char)((uint)fVar22 >> 0x17);
                      uVar16 = uVar16 | uVar9 >> (0x7eU - cVar4 & 0x1f);
                      uVar14 = (ulong)uVar16;
                      if (0x80000000 < uVar9 << (cVar4 + 0xa2U & 0x1f)) {
                        uVar14 = (ulong)(uVar16 + 1);
                      }
                    }
                  }
                  else if ((uint)fVar22 < 0x7f800000) {
                    if ((uint)fVar22 < 0x477ff000) {
                      uVar14 = (ulong)((int)fVar22 + 0x8000fff +
                                       (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd | uVar16);
                    }
                    else {
                      uVar14 = (ulong)(uVar16 | 0x7c00);
                    }
                  }
                  else {
                    uVar14 = (ulong)(uVar16 | 0x7c00);
                    if (fVar22 != INFINITY) {
                      uVar9 = (uint)fVar22 >> 0xd & 0x3ff;
                      uVar14 = (ulong)(uVar16 | 0x7c00 | uVar9 | (uint)(uVar9 == 0));
                    }
                  }
                  pRVar2[lVar8 + lVar20].g._h = (uint16_t)uVar14;
                  fVar24 = (fVar24 + 0.66667) - (float)(int)(fVar24 + 0.66667);
                  fVar24 = fVar24 + fVar24;
                  fVar22 = (float)(~-(uint)(fVar24 < 1.0) & (uint)(2.0 - fVar24) |
                                  (uint)fVar24 & -(uint)(fVar24 < 1.0)) * 4.0 + 0.1 +
                           *(float *)(lVar6 + (uVar18 & 0xffff) * 4);
                  fVar24 = ABS(fVar22);
                  uVar16 = (uint)fVar22 >> 0x10 & 0x8000;
                  uVar18 = (ulong)uVar16;
                  if ((uint)fVar24 < 0x38800000) {
                    if (0x33000000 < (uint)fVar24) {
                      uVar9 = (uint)fVar24 & 0x7fffff | 0x800000;
                      cVar4 = (char)((uint)fVar24 >> 0x17);
                      uVar16 = uVar16 | uVar9 >> (0x7eU - cVar4 & 0x1f);
                      uVar18 = (ulong)uVar16;
                      if (0x80000000 < uVar9 << (cVar4 + 0xa2U & 0x1f)) {
                        uVar18 = (ulong)(uVar16 + 1);
                      }
                    }
                  }
                  else if ((uint)fVar24 < 0x7f800000) {
                    if ((uint)fVar24 < 0x477ff000) {
                      uVar18 = (ulong)((int)fVar24 + 0x8000fff +
                                       (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd | uVar16);
                    }
                    else {
                      uVar18 = (ulong)(uVar16 | 0x7c00);
                    }
                  }
                  else {
                    uVar18 = (ulong)(uVar16 | 0x7c00);
                    if (fVar24 != INFINITY) {
                      uVar9 = (uint)fVar24 >> 0xd & 0x3ff;
                      uVar18 = (ulong)(uVar16 | 0x7c00 | uVar9 | (uint)(uVar9 == 0));
                    }
                  }
                  pRVar2[lVar8 + lVar20].b._h = (uint16_t)uVar18;
                  dVar27 = dVar27 + 1.0;
                  iVar12 = iVar12 + 1;
                } while (iVar12 != iVar10);
              }
              local_a0 = local_a0 + 1.0;
              iVar13 = iVar13 + 1;
            } while (iVar13 != iVar11);
          }
          fVar22 = *(float *)(lVar5 + (ulong)pRVar2[lVar8 + lVar20].r._h * 4) * fVar21;
          fVar24 = ABS(fVar22);
          uVar7 = (ushort)((uint)fVar22 >> 0x10) & 0x8000;
          if ((uint)fVar24 < 0x38800000) {
            if ((0x33000000 < (uint)fVar24) &&
               (uVar16 = (uint)fVar24 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar24 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar16 >> (0x7eU - cVar4 & 0x1f)),
               0x80000000 < uVar16 << (cVar4 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar24 < 0x7f800000) {
            if ((uint)fVar24 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >>
                              0xd) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar24 != INFINITY) {
              uVar16 = (uint)fVar24 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          pRVar2[lVar8 + lVar20].r._h = uVar7;
          fVar22 = *(float *)(lVar5 + (ulong)pRVar2[lVar8 + lVar20].g._h * 4) * fVar21;
          fVar24 = ABS(fVar22);
          uVar7 = (ushort)((uint)fVar22 >> 0x10) & 0x8000;
          if ((uint)fVar24 < 0x38800000) {
            if ((0x33000000 < (uint)fVar24) &&
               (uVar16 = (uint)fVar24 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar24 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar16 >> (0x7eU - cVar4 & 0x1f)),
               0x80000000 < uVar16 << (cVar4 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar24 < 0x7f800000) {
            if ((uint)fVar24 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >>
                              0xd) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar24 != INFINITY) {
              uVar16 = (uint)fVar24 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          pRVar2[lVar8 + lVar20].g._h = uVar7;
          fVar22 = *(float *)(lVar5 + (ulong)pRVar2[lVar8 + lVar20].b._h * 4) * fVar21;
          fVar24 = ABS(fVar22);
          uVar7 = (ushort)((uint)fVar22 >> 0x10) & 0x8000;
          if ((uint)fVar24 < 0x38800000) {
            if ((0x33000000 < (uint)fVar24) &&
               (uVar16 = (uint)fVar24 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar24 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar16 >> (0x7eU - cVar4 & 0x1f)),
               0x80000000 < uVar16 << (cVar4 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar24 < 0x7f800000) {
            if ((uint)fVar24 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >>
                              0xd) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar24 != INFINITY) {
              uVar16 = (uint)fVar24 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          pRVar2[lVar8 + lVar20].b._h = uVar7;
          fVar22 = *(float *)(lVar5 + (ulong)pRVar2[lVar8 + lVar20].a._h * 4) * fVar21;
          fVar24 = ABS(fVar22);
          uVar7 = (ushort)((uint)fVar22 >> 0x10) & 0x8000;
          if ((uint)fVar24 < 0x38800000) {
            if ((0x33000000 < (uint)fVar24) &&
               (uVar16 = (uint)fVar24 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar24 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar16 >> (0x7eU - cVar4 & 0x1f)),
               0x80000000 < uVar16 << (cVar4 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar24 < 0x7f800000) {
            if ((uint)fVar24 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >>
                              0xd) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar24 != INFINITY) {
              uVar16 = (uint)fVar24 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          pRVar2[lVar8 + lVar20].a._h = uVar7;
          lVar15 = lVar15 + 1;
        } while (lVar15 != xMax);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != yMax);
  }
  return;
}

Assistant:

void
mndl (
    Array2D<P>& px,
    int         w,
    int         h,
    int         xMin,
    int         xMax,
    int         yMin,
    int         yMax,
    int         xSamples,
    int         ySamples,
    double      rMin,
    double      rMax,
    double      iMin,
    double      aspect,
    double      rSeed,
    double      iSeed)
{
    if (xSamples > 6) xSamples = 6;

    if (ySamples > 6) ySamples = 6;

    double iMax = iMin + aspect * (rMax - rMin) * h / w;
    double sx   = double (rMax - rMin) / w;
    double sy   = double (iMax - iMin) / h;
    double tx   = 1.f / xSamples;
    double ty   = 1.f / ySamples;
    float  t    = tx * ty;

    for (int y = yMin; y < yMax; ++y)
    {
        for (int x = xMin; x < xMax; ++x)
        {
            P& p = px[y - yMin][x - xMin];

            clear (p);

            for (int i = 0; i < xSamples; ++i)
            {
                for (int j = 0; j < ySamples; ++j)
                {
                    const double a    = rMin + sx * (x + i * tx);
                    const double b    = iMin + sy * (y + j * ty);
                    const double sMax = 100;
                    const int    kMax = 256;
                    double       r    = rSeed;
                    double       i    = iSeed;
                    double       s    = 0;
                    int          k    = 0;

                    while (k < kMax && s < sMax)
                    {
                        s = r * r - i * i;
                        i = 2 * r * i + b;
                        r = s + a;
                        k++;
                    }

                    add (k / float (kMax), p);
                }
            }

            scale (t, p);
        }
    }
}